

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.cpp
# Opt level: O2

void __thiscall ui::anon_unknown_0::sshImpl::~sshImpl(sshImpl *this)

{
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__sshImpl_00167ba8;
  std::__cxx11::string::~string((string *)&this->status);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->disable).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->enable).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->tog).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ftxui::ComponentBase::~ComponentBase((ComponentBase *)this);
  return;
}

Assistant:

~sshImpl() = default;